

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

int uv_interface_addresses(uv_interface_address_t **addresses,int *count)

{
  char cVar1;
  short *psVar2;
  char *__s;
  char *__s1;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  uv_interface_address_t *puVar9;
  char *pcVar10;
  size_t __n;
  long *plVar11;
  long *plVar12;
  undefined4 uVar13;
  in_addr_t iVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  ifaddrs *addrs;
  int local_54;
  long *local_50;
  int *local_48;
  long *local_40;
  uv_interface_address_t **local_38;
  
  *count = 0;
  *addresses = (uv_interface_address_t *)0x0;
  iVar5 = getifaddrs(&local_50);
  plVar11 = local_50;
  if (iVar5 != 0) {
    piVar8 = __errno_location();
    return -*piVar8;
  }
  for (; plVar11 != (long *)0x0; plVar11 = (long *)*plVar11) {
    if ((((~*(uint *)(plVar11 + 2) & 0x41) == 0) && ((short *)plVar11[3] != (short *)0x0)) &&
       (*(short *)plVar11[3] != 0x11)) {
      *count = *count + 1;
    }
  }
  if ((long)*count == 0) {
    freeifaddrs();
    return 0;
  }
  puVar9 = (uv_interface_address_t *)uv__calloc((long)*count,0x60);
  *addresses = puVar9;
  if (puVar9 == (uv_interface_address_t *)0x0) {
    freeifaddrs(local_50);
    return -0xc;
  }
  plVar11 = local_50;
  if (local_50 != (long *)0x0) {
    do {
      if ((((~*(uint *)(plVar11 + 2) & 0x41) == 0) && ((short *)plVar11[3] != (short *)0x0)) &&
         (*(short *)plVar11[3] != 0x11)) {
        pcVar10 = uv__strdup((char *)plVar11[1]);
        puVar9->name = pcVar10;
        psVar2 = (short *)plVar11[3];
        if (*psVar2 == 10) {
          uVar13 = *(undefined4 *)psVar2;
          iVar14 = *(in_addr_t *)(psVar2 + 2);
          uVar15 = *(undefined4 *)(psVar2 + 4);
          uVar16 = *(undefined4 *)(psVar2 + 6);
          uVar4 = *(undefined8 *)(psVar2 + 10);
          *(undefined8 *)((long)&puVar9->address + 0xc) = *(undefined8 *)(psVar2 + 6);
          *(undefined8 *)((long)&puVar9->address + 0x14) = uVar4;
        }
        else {
          uVar13 = *(undefined4 *)psVar2;
          iVar14 = *(in_addr_t *)(psVar2 + 2);
          uVar15 = *(undefined4 *)(psVar2 + 4);
          uVar16 = *(undefined4 *)(psVar2 + 6);
        }
        *(undefined4 *)&puVar9->address = uVar13;
        (puVar9->address).address4.sin_addr.s_addr = iVar14;
        *(undefined4 *)((long)&puVar9->address + 8) = uVar15;
        *(undefined4 *)((long)&puVar9->address + 0xc) = uVar16;
        psVar2 = (short *)plVar11[4];
        if (*psVar2 == 10) {
          uVar13 = *(undefined4 *)psVar2;
          iVar14 = *(in_addr_t *)(psVar2 + 2);
          uVar15 = *(undefined4 *)(psVar2 + 4);
          uVar16 = *(undefined4 *)(psVar2 + 6);
          uVar4 = *(undefined8 *)(psVar2 + 10);
          *(undefined8 *)((long)&puVar9->netmask + 0xc) = *(undefined8 *)(psVar2 + 6);
          *(undefined8 *)((long)&puVar9->netmask + 0x14) = uVar4;
        }
        else {
          uVar13 = *(undefined4 *)psVar2;
          iVar14 = *(in_addr_t *)(psVar2 + 2);
          uVar15 = *(undefined4 *)(psVar2 + 4);
          uVar16 = *(undefined4 *)(psVar2 + 6);
        }
        *(undefined4 *)&puVar9->netmask = uVar13;
        (puVar9->netmask).netmask4.sin_addr.s_addr = iVar14;
        *(undefined4 *)((long)&puVar9->netmask + 8) = uVar15;
        *(undefined4 *)((long)&puVar9->netmask + 0xc) = uVar16;
        uVar6 = *(uint *)(plVar11 + 2);
        if ((((uVar6 & 2) != 0) && (psVar2 = (short *)plVar11[5], psVar2 != (short *)0x0)) &&
           (*psVar2 == 2)) {
          uVar4 = *(undefined8 *)(psVar2 + 4);
          *(undefined8 *)&puVar9->broadcast = *(undefined8 *)psVar2;
          *(undefined8 *)((long)&puVar9->broadcast + 8) = uVar4;
          uVar6 = *(uint *)(plVar11 + 2);
        }
        puVar9->is_internal = uVar6 >> 3 & 1;
        puVar9 = puVar9 + 1;
      }
      plVar11 = (long *)*plVar11;
    } while (plVar11 != (long *)0x0);
    if (local_50 != (long *)0x0) {
      local_40 = local_50;
      plVar12 = local_50;
      local_48 = count;
      local_38 = addresses;
      do {
        if (((((~*(uint *)(plVar12 + 2) & 0x41) == 0) && ((short *)plVar12[3] != (short *)0x0)) &&
            (*(short *)plVar12[3] == 0x11)) && (local_54 = *local_48, 0 < local_54)) {
          pcVar10 = (*local_38)->phys_addr;
          iVar5 = 0;
          do {
            __s = (char *)plVar12[1];
            __n = strlen(__s);
            __s1 = ((uv_interface_address_t *)(pcVar10 + -8))->name;
            iVar7 = strncmp(__s1,__s,__n);
            if ((iVar7 == 0) && ((cVar1 = __s1[__n], cVar1 == ':' || (cVar1 == '\0')))) {
              lVar3 = plVar12[3];
              *(undefined2 *)(pcVar10 + 4) = *(undefined2 *)(lVar3 + 0x10);
              *(undefined4 *)pcVar10 = *(undefined4 *)(lVar3 + 0xc);
              local_54 = *local_48;
            }
            iVar5 = iVar5 + 1;
            pcVar10 = pcVar10 + 0x60;
          } while (iVar5 < local_54);
        }
        plVar12 = (long *)*plVar12;
        plVar11 = local_40;
      } while (plVar12 != (long *)0x0);
      goto LAB_0011d2d0;
    }
  }
  plVar11 = (long *)0x0;
LAB_0011d2d0:
  freeifaddrs(plVar11);
  return 0;
}

Assistant:

int uv_interface_addresses(uv_interface_address_t** addresses, int* count) {
  struct ifaddrs *addrs, *ent;
  uv_interface_address_t* address;
  int i;
  struct sockaddr_ll *sll;

  *count = 0;
  *addresses = NULL;

  if (getifaddrs(&addrs))
    return UV__ERR(errno);

  /* Count the number of interfaces */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFADDR))
      continue;

    (*count)++;
  }

  if (*count == 0) {
    freeifaddrs(addrs);
    return 0;
  }

  /* Make sure the memory is initiallized to zero using calloc() */
  *addresses = uv__calloc(*count, sizeof(**addresses));
  if (!(*addresses)) {
    freeifaddrs(addrs);
    return UV_ENOMEM;
  }

  address = *addresses;

  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFADDR))
      continue;

    address->name = uv__strdup(ent->ifa_name);

    if (ent->ifa_addr->sa_family == AF_INET6) {
      address->address.address6 = *((struct sockaddr_in6*) ent->ifa_addr);
    } else {
      address->address.address4 = *((struct sockaddr_in*) ent->ifa_addr);
    }

    if (ent->ifa_netmask->sa_family == AF_INET6) {
      address->netmask.netmask6 = *((struct sockaddr_in6*) ent->ifa_netmask);
    } else {
      address->netmask.netmask4 = *((struct sockaddr_in*) ent->ifa_netmask);
    }

    if (ent->ifa_flags & IFF_BROADCAST && ent->ifa_broadaddr != NULL) {
      if (ent->ifa_broadaddr->sa_family == AF_INET)
        address->broadcast.broadcast4 = *((struct sockaddr_in*) ent->ifa_broadaddr);
    }

    address->is_internal = !!(ent->ifa_flags & IFF_LOOPBACK);

    address++;
  }

  /* Fill in physical addresses for each interface */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFPHYS))
      continue;

    address = *addresses;

    for (i = 0; i < (*count); i++) {
      size_t namelen = strlen(ent->ifa_name);
      /* Alias interface share the same physical address */
      if (strncmp(address->name, ent->ifa_name, namelen) == 0 &&
          (address->name[namelen] == 0 || address->name[namelen] == ':')) {
        sll = (struct sockaddr_ll*)ent->ifa_addr;
        memcpy(address->phys_addr, sll->sll_addr, sizeof(address->phys_addr));
      }
      address++;
    }
  }

  freeifaddrs(addrs);

  return 0;
}